

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O0

bool __thiscall EefcFlash::getBod(EefcFlash *this)

{
  uint32_t uVar1;
  EefcFlash *this_local;
  
  if ((this->_canBrownout & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    waitFSR(this,1);
    writeFCR0(this,'\r',0);
    waitFSR(this,1);
    uVar1 = readFRR0(this);
    this_local._7_1_ = (uVar1 & 2) != 0;
  }
  return this_local._7_1_;
}

Assistant:

bool
EefcFlash::getBod()
{
    if (!_canBrownout)
        return false;

    waitFSR();
    writeFCR0(EEFC_FCMD_GGPB, 0);
    waitFSR();
    return (readFRR0() & (1 << 1));
}